

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O1

void __thiscall Iir::Cascade::setLayout(Cascade *this,LayoutBase *proto)

{
  double dVar1;
  int iVar2;
  PoleZeroPair *pair;
  invalid_argument *this_00;
  Biquad *pBVar3;
  double __z;
  double dVar4;
  
  iVar2 = (proto->m_numPoles - (proto->m_numPoles + 1 >> 0x1f)) + 1 >> 1;
  this->m_numStages = iVar2;
  if (this->m_maxStages < iVar2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Number of stages is larger than the max stages.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (0 < this->m_maxStages) {
    pBVar3 = this->m_stageArray;
    iVar2 = 0;
    do {
      Biquad::setIdentity(pBVar3);
      iVar2 = iVar2 + 1;
      pBVar3 = pBVar3 + 1;
    } while (iVar2 < this->m_maxStages);
  }
  if (0 < this->m_numStages) {
    pBVar3 = this->m_stageArray;
    iVar2 = 0;
    do {
      pair = LayoutBase::getPair(proto,iVar2);
      Biquad::setPoleZeroPair(pBVar3,pair);
      iVar2 = iVar2 + 1;
      pBVar3 = pBVar3 + 1;
    } while (iVar2 < this->m_numStages);
  }
  dVar1 = proto->m_normalGain;
  response(this,proto->m_normalW / 6.283185307179586);
  dVar4 = cabs(__z);
  if (0 < this->m_numStages) {
    Biquad::applyScale(this->m_stageArray,dVar1 / dVar4);
    return;
  }
  return;
}

Assistant:

void Cascade::applyScale (double scale)
	{
		if (m_numStages < 1) return;
		m_stageArray->applyScale (scale);
	}